

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

SPIRVariable * __thiscall
diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRVariable>::
allocate<diligent_spirv_cross::SPIRVariable&>
          (ObjectPool<diligent_spirv_cross::SPIRVariable> *this,SPIRVariable *p)

{
  uint uVar1;
  SPIRVariable *this_00;
  bool bVar2;
  size_t sVar3;
  SPIRVariable **ppSVar4;
  SPIRVariable *ptr;
  uint local_34;
  SPIRVariable *pSStack_30;
  uint i;
  SPIRVariable *ptr_1;
  SPIRVariable *pSStack_20;
  uint num_objects;
  SPIRVariable *p_local;
  ObjectPool<diligent_spirv_cross::SPIRVariable> *this_local;
  
  pSStack_20 = p;
  p_local = (SPIRVariable *)this;
  bVar2 = VectorView<diligent_spirv_cross::SPIRVariable_*>::empty
                    (&(this->vacants).super_VectorView<diligent_spirv_cross::SPIRVariable_*>);
  if (bVar2) {
    uVar1 = this->start_object_count;
    sVar3 = VectorView<std::unique_ptr<diligent_spirv_cross::SPIRVariable,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRVariable>::MallocDeleter>_>
            ::size(&(this->memory).
                    super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRVariable,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRVariable>::MallocDeleter>_>
                  );
    ptr_1._4_4_ = uVar1 << ((byte)sVar3 & 0x1f);
    pSStack_30 = (SPIRVariable *)malloc((ulong)ptr_1._4_4_ * 0xb0);
    if (pSStack_30 == (SPIRVariable *)0x0) {
      return (SPIRVariable *)0x0;
    }
    SmallVector<diligent_spirv_cross::SPIRVariable_*,_0UL>::reserve
              (&this->vacants,(ulong)ptr_1._4_4_);
    for (local_34 = 0; local_34 < ptr_1._4_4_; local_34 = local_34 + 1) {
      ptr = pSStack_30 + local_34;
      SmallVector<diligent_spirv_cross::SPIRVariable_*,_0UL>::push_back(&this->vacants,&ptr);
    }
    SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRVariable,diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRVariable>::MallocDeleter>,8ul>
    ::emplace_back<diligent_spirv_cross::SPIRVariable*&>
              ((SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRVariable,diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRVariable>::MallocDeleter>,8ul>
                *)&this->memory,&stack0xffffffffffffffd0);
  }
  ppSVar4 = VectorView<diligent_spirv_cross::SPIRVariable_*>::back
                      (&(this->vacants).super_VectorView<diligent_spirv_cross::SPIRVariable_*>);
  this_00 = *ppSVar4;
  SmallVector<diligent_spirv_cross::SPIRVariable_*,_0UL>::pop_back(&this->vacants);
  SPIRVariable::SPIRVariable(this_00,pSStack_20);
  return this_00;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}